

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cpp
# Opt level: O0

void CDiv(double ar,double ai,double br,double bi,double *cr,double *ci)

{
  double dVar1;
  undefined1 auVar3 [16];
  double dVar2;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double brs;
  double ars;
  double bis;
  double ais;
  double s;
  double *ci_local;
  double *cr_local;
  double bi_local;
  double br_local;
  double ai_local;
  double ar_local;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = br;
  auVar7._8_8_ = 0x7fffffffffffffff;
  auVar7._0_8_ = 0x7fffffffffffffff;
  auVar3 = vpand_avx(auVar3,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = bi;
  auVar12._8_8_ = 0x7fffffffffffffff;
  auVar12._0_8_ = 0x7fffffffffffffff;
  auVar5 = vpand_avx(auVar8,auVar12);
  dVar1 = auVar3._0_8_ + auVar5._0_8_;
  auVar4._0_8_ = br / dVar1;
  dVar2 = bi / dVar1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = auVar4._0_8_;
  auVar4._8_8_ = 0;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar2 * dVar2;
  auVar3 = vfmadd213sd_fma(auVar4,auVar9,auVar13);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = ar / dVar1;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = auVar4._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (ai / dVar1) * dVar2;
  auVar5 = vfmadd213sd_fma(auVar5,auVar10,auVar14);
  *cr = auVar5._0_8_ / auVar3._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = ai / dVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = auVar4._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = -((ar / dVar1) * dVar2);
  auVar5 = vfmadd213sd_fma(auVar6,auVar11,auVar15);
  *ci = auVar5._0_8_ / auVar3._0_8_;
  return;
}

Assistant:

void CDiv (double ar, double ai, double br, double bi, double *cr, double *ci)

{
	double		s, ais, bis, ars, brs;

	s = fabs(br) + fabs(bi);
	ars = ar / s;
	ais = ai / s;
	brs = br / s;
	bis = bi / s;
	s = brs*brs + bis*bis;
	*cr = (ars*brs + ais*bis) / s;
	*ci = (ais*brs - ars*bis) / s;
}